

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall CTPNListBase::fold_constants(CTPNListBase *this,CTcPrsSymtab *symtab)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RSI;
  CTcPrsNode *in_RDI;
  int all_const;
  CTPNListEle *cur;
  CTPNListEleBase *local_20;
  
  if (((ulong)in_RDI[9].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 1) == 0) {
    bVar1 = true;
    for (local_20 = (CTPNListEleBase *)in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
        local_20 != (CTPNListEleBase *)0x0;
        local_20 = &CTPNListEleBase::get_next(local_20)->super_CTPNListEleBase) {
      (*(local_20->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0xf])
                (local_20,in_RSI);
      CTPNListEleBase::get_expr(local_20);
      iVar2 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2ad2f4);
      if (iVar2 == 0) {
        bVar1 = false;
      }
    }
    if (bVar1) {
      *(byte *)&in_RDI[9].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase =
           *(byte *)&in_RDI[9].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase & 0xfe | 1;
    }
  }
  return in_RDI;
}

Assistant:

CTcPrsNode *CTPNListBase::fold_constants(CTcPrsSymtab *symtab)
{
    CTPNListEle *cur;
    int all_const;

    /* 
     *   if the list is already constant, there's nothing extra we need to
     *   do 
     */
    if (is_const_)
        return this;

    /* presume the result will be all constants */
    all_const = TRUE;
    
    /* run through my list and fold each element */
    for (cur = head_ ; cur != 0 ; cur = cur->get_next())
    {
        /* fold this element */
        cur->fold_constants(symtab);

        /* 
         *   if this element is not a constant, the whole list cannot be
         *   constant 
         */
        if (!cur->get_expr()->is_const())
            all_const = FALSE;
    }

    /* if every element was a constant, the overall list is constant */
    if (all_const)
        is_const_ = TRUE;

    /* return myself */
    return this;
}